

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int reportProcessingInstruction(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  STRING_POOL *pool;
  int iVar1;
  XML_Char *pXVar2;
  char *pcVar3;
  XML_Char *s;
  int iVar4;
  
  if (parser->m_processingInstructionHandler == (XML_ProcessingInstructionHandler)0x0) {
    iVar4 = 1;
    if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
      reportDefault(parser,enc,start,end);
    }
  }
  else {
    pcVar3 = start + (long)enc->minBytesPerChar * 2;
    iVar1 = (*enc->nameLength)(enc,pcVar3);
    pool = &parser->m_tempPool;
    pXVar2 = poolStoreString(pool,enc,pcVar3,pcVar3 + iVar1);
    iVar4 = 0;
    if (pXVar2 != (XML_Char *)0x0) {
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
      pcVar3 = (*enc->skipS)(enc,pcVar3 + iVar1);
      s = poolStoreString(pool,enc,pcVar3,end + (long)enc->minBytesPerChar * -2);
      if (s != (XML_Char *)0x0) {
        normalizeLines(s);
        (*parser->m_processingInstructionHandler)(parser->m_handlerArg,pXVar2,s);
        poolClear(pool);
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
reportProcessingInstruction(XML_Parser parser, const ENCODING *enc,
                            const char *start, const char *end)
{
  const XML_Char *target;
  XML_Char *data;
  const char *tem;
  if (!parser->m_processingInstructionHandler) {
    if (parser->m_defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  start += enc->minBytesPerChar * 2;
  tem = start + XmlNameLength(enc, start);
  target = poolStoreString(&parser->m_tempPool, enc, start, tem);
  if (!target)
    return 0;
  poolFinish(&parser->m_tempPool);
  data = poolStoreString(&parser->m_tempPool, enc,
                        XmlSkipS(enc, tem),
                        end - enc->minBytesPerChar*2);
  if (!data)
    return 0;
  normalizeLines(data);
  parser->m_processingInstructionHandler(parser->m_handlerArg, target, data);
  poolClear(&parser->m_tempPool);
  return 1;
}